

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O3

int __thiscall
de::BlockBuffer<unsigned_char>::writeToCurrentBlock
          (BlockBuffer<unsigned_char> *this,int numElements,uchar *elements,bool blocking)

{
  uchar *puVar1;
  deBool dVar2;
  int iVar3;
  undefined8 *puVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  iVar3 = this->m_writePos;
  if (iVar3 == 0) {
    if (blocking) {
      deSemaphore_decrement(this->m_empty);
    }
    else {
      dVar2 = deSemaphore_tryDecrement(this->m_empty);
      if (dVar2 == 0) {
        return 0;
      }
    }
    if (this->m_canceled != 0) {
      deSemaphore_increment(this->m_empty);
      Mutex::unlock(&this->m_writeLock);
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = &PTR__exception_0014f8c0;
      __cxa_throw(puVar4,&BufferCanceledException::typeinfo,std::exception::~exception);
    }
    iVar3 = this->m_writePos;
  }
  iVar5 = this->m_blockSize;
  uVar8 = (ulong)(uint)(iVar5 - iVar3);
  if (numElements < iVar5 - iVar3) {
    uVar8 = (ulong)(uint)numElements;
  }
  iVar7 = (int)uVar8;
  if (0 < iVar7) {
    iVar3 = this->m_writeBlock;
    puVar1 = this->m_elements;
    uVar6 = 0;
    do {
      puVar1[(long)(this->m_writePos + (int)uVar6) + (long)(iVar5 * iVar3)] = elements[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
    iVar3 = this->m_writePos;
    iVar5 = this->m_blockSize;
  }
  this->m_writePos = iVar3 + iVar7;
  if (iVar3 + iVar7 == iVar5) {
    this->m_numUsedInBlock[this->m_writeBlock] = iVar5;
    this->m_writeBlock = (this->m_writeBlock + 1) % this->m_numBlocks;
    this->m_writePos = 0;
    deSemaphore_increment(this->m_fill);
  }
  return iVar7;
}

Assistant:

int BlockBuffer<T>::writeToCurrentBlock (int numElements, const T* elements, bool blocking)
{
	DE_ASSERT(numElements > 0 && elements != DE_NULL);

	if (m_writePos == 0)
	{
		/* Write thread doesn't own current block - need to acquire. */
		if (blocking)
			deSemaphore_decrement(m_empty);
		else
		{
			if (!deSemaphore_tryDecrement(m_empty))
				return 0;
		}

		/* Check for canceled bit. */
		if (m_canceled)
		{
			// \todo [2012-07-06 pyry] A bit hackish to assume that write lock is not freed if exception is thrown out here.
			deSemaphore_increment(m_empty);
			m_writeLock.unlock();
			throw CanceledException();
		}
	}

	/* Write thread owns current block. */
	T*		block			= m_elements + m_writeBlock*m_blockSize;
	int		numToWrite		= de::min(numElements, m_blockSize-m_writePos);

	DE_ASSERT(numToWrite > 0);

	for (int ndx = 0; ndx < numToWrite; ndx++)
		block[m_writePos+ndx] = elements[ndx];

	m_writePos += numToWrite;

	if (m_writePos == m_blockSize)
		flushWriteBlock(); /* Flush current write block. */

	return numToWrite;
}